

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.h
# Opt level: O2

string * __thiscall
pstack::stringify<char_const(&)[16],pstack::Dwarf::Tag,char_const(&)[2]>
          (string *__return_storage_ptr__,pstack *this,char (*things) [16],Tag *things_1,
          char (*things_2) [2])

{
  ostream *poVar1;
  ostringstream local_1a8 [8];
  ostringstream stream;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,(char *)this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)*things);
  std::operator<<(poVar1,(char *)things_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string
stringify(Stuff&&... things)
{
    std::ostringstream stream;
    ( stream <<  ... << things );
    return stream.str();
}